

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_create_scaling_group.cc
# Opt level: O2

int __thiscall
aliyun::Ess::CreateScalingGroup
          (Ess *this,EssCreateScalingGroupRequestType *req,
          EssCreateScalingGroupResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_65c;
  allocator<char> local_65b;
  allocator<char> local_65a;
  allocator<char> local_659;
  string local_658;
  Value val;
  string str_response;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_65c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"CreateScalingGroup",&local_65c);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->scaling_group_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"ScalingGroupName",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->scaling_group_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->min_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"MinSize",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->min_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->max_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"MaxSize",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->max_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->default_cooldown)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"DefaultCooldown",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->default_cooldown);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"LoadBalancerId",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->load_balancer_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((req->db_instance_id1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"DBInstanceId.1",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_480,(string *)&req->db_instance_id1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((req->db_instance_id2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"DBInstanceId.2",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_4c0,(string *)&req->db_instance_id2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  if ((req->db_instance_id3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"DBInstanceId.3",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_500,(string *)&req->db_instance_id3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4e0,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  if ((req->removal_policy1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"RemovalPolicy.1",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_540,(string *)&req->removal_policy1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_520,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
  }
  if ((req->removal_policy2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"RemovalPolicy.2",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_580,(string *)&req->removal_policy2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_560,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"OwnerAccount",(allocator<char> *)&local_658);
    std::__cxx11::string::string((string *)&local_5c0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5a0,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"RegionId",(allocator<char> *)&local_658);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,this->region_id_,&local_65c);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5e0,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_658,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_658,anon_var_dwarf_10f6e6 + 9,&local_65c);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_658,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_658,anon_var_dwarf_10f6e6 + 9,&local_659);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_658,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_658,anon_var_dwarf_10f6e6 + 9,&local_65a);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_658,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_658,anon_var_dwarf_10f6e6 + 9,&local_65b);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
      }
      if (response != (EssCreateScalingGroupResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"ScalingGroupId");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"ScalingGroupId");
          Json::Value::asString_abi_cxx11_(&local_658,pVVar3);
          std::__cxx11::string::operator=((string *)response,(string *)&local_658);
          std::__cxx11::string::~string((string *)&local_658);
        }
      }
      goto LAB_0012fbd3;
    }
  }
  iVar2 = -1;
  if (error_info != (EssErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012fbd3:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ess::CreateScalingGroup(const EssCreateScalingGroupRequestType& req,
                      EssCreateScalingGroupResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreateScalingGroup");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.scaling_group_name.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupName", req.scaling_group_name);
  }
  if(!req.min_size.empty()) {
    req_rpc->AddRequestQuery("MinSize", req.min_size);
  }
  if(!req.max_size.empty()) {
    req_rpc->AddRequestQuery("MaxSize", req.max_size);
  }
  if(!req.default_cooldown.empty()) {
    req_rpc->AddRequestQuery("DefaultCooldown", req.default_cooldown);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.db_instance_id1.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId.1", req.db_instance_id1);
  }
  if(!req.db_instance_id2.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId.2", req.db_instance_id2);
  }
  if(!req.db_instance_id3.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId.3", req.db_instance_id3);
  }
  if(!req.removal_policy1.empty()) {
    req_rpc->AddRequestQuery("RemovalPolicy.1", req.removal_policy1);
  }
  if(!req.removal_policy2.empty()) {
    req_rpc->AddRequestQuery("RemovalPolicy.2", req.removal_policy2);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}